

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord_r.hh
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
testgen_r::_bigrecord_r_Union__3__::get_bytes(_bigrecord_r_Union__3__ *this)

{
  Exception *this_00;
  long *in_RSI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  string *in_stack_ffffffffffffff88;
  any *in_stack_ffffffffffffff98;
  allocator<char> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (*in_RSI != 0) {
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    avro::Exception::Exception(this_00,in_stack_ffffffffffffff88);
    __cxa_throw(this_00,&avro::Exception::typeinfo,avro::Exception::~Exception);
  }
  boost::any_cast<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff98);
  return in_RDI;
}

Assistant:

inline
std::vector<uint8_t> _bigrecord_r_Union__3__::get_bytes() const {
    if (idx_ != 0) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::vector<uint8_t> >(value_);
}